

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O1

void write_wiener_filter(int wiener_win,WienerInfo *wiener_info,WienerInfo *ref_wiener_info,
                        aom_writer *wb)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  
  if (wiener_win == 7) {
    aom_write_primitive_refsubexpfin
              (wb,0x10,1,(short)*(undefined4 *)ref_wiener_info->vfilter + 5,
               (short)*(undefined4 *)wiener_info->vfilter + 5);
  }
  aom_write_primitive_refsubexpfin
            (wb,0x20,2,ref_wiener_info->vfilter[1] + 0x17,wiener_info->vfilter[1] + 0x17);
  aom_write_primitive_refsubexpfin
            (wb,0x40,3,(short)*(undefined4 *)(ref_wiener_info->vfilter + 2) + 0x11,
             (short)*(undefined4 *)(wiener_info->vfilter + 2) + 0x11);
  if (wiener_win == 7) {
    aom_write_primitive_refsubexpfin
              (wb,0x10,1,(short)*(undefined4 *)ref_wiener_info->hfilter + 5,
               (short)*(undefined4 *)wiener_info->hfilter + 5);
  }
  aom_write_primitive_refsubexpfin
            (wb,0x20,2,ref_wiener_info->hfilter[1] + 0x17,wiener_info->hfilter[1] + 0x17);
  aom_write_primitive_refsubexpfin
            (wb,0x40,3,(short)*(undefined4 *)(ref_wiener_info->hfilter + 2) + 0x11,
             (short)*(undefined4 *)(wiener_info->hfilter + 2) + 0x11);
  uVar1 = *(undefined8 *)wiener_info->vfilter;
  uVar2 = *(undefined8 *)(wiener_info->vfilter + 4);
  uVar3 = *(undefined8 *)(wiener_info->hfilter + 4);
  *(undefined8 *)ref_wiener_info->hfilter = *(undefined8 *)wiener_info->hfilter;
  *(undefined8 *)(ref_wiener_info->hfilter + 4) = uVar3;
  *(undefined8 *)ref_wiener_info->vfilter = uVar1;
  *(undefined8 *)(ref_wiener_info->vfilter + 4) = uVar2;
  return;
}

Assistant:

static inline void write_wiener_filter(int wiener_win,
                                       const WienerInfo *wiener_info,
                                       WienerInfo *ref_wiener_info,
                                       aom_writer *wb) {
  if (wiener_win == WIENER_WIN)
    aom_write_primitive_refsubexpfin(
        wb, WIENER_FILT_TAP0_MAXV - WIENER_FILT_TAP0_MINV + 1,
        WIENER_FILT_TAP0_SUBEXP_K,
        ref_wiener_info->vfilter[0] - WIENER_FILT_TAP0_MINV,
        wiener_info->vfilter[0] - WIENER_FILT_TAP0_MINV);
  else
    assert(wiener_info->vfilter[0] == 0 &&
           wiener_info->vfilter[WIENER_WIN - 1] == 0);
  aom_write_primitive_refsubexpfin(
      wb, WIENER_FILT_TAP1_MAXV - WIENER_FILT_TAP1_MINV + 1,
      WIENER_FILT_TAP1_SUBEXP_K,
      ref_wiener_info->vfilter[1] - WIENER_FILT_TAP1_MINV,
      wiener_info->vfilter[1] - WIENER_FILT_TAP1_MINV);
  aom_write_primitive_refsubexpfin(
      wb, WIENER_FILT_TAP2_MAXV - WIENER_FILT_TAP2_MINV + 1,
      WIENER_FILT_TAP2_SUBEXP_K,
      ref_wiener_info->vfilter[2] - WIENER_FILT_TAP2_MINV,
      wiener_info->vfilter[2] - WIENER_FILT_TAP2_MINV);
  if (wiener_win == WIENER_WIN)
    aom_write_primitive_refsubexpfin(
        wb, WIENER_FILT_TAP0_MAXV - WIENER_FILT_TAP0_MINV + 1,
        WIENER_FILT_TAP0_SUBEXP_K,
        ref_wiener_info->hfilter[0] - WIENER_FILT_TAP0_MINV,
        wiener_info->hfilter[0] - WIENER_FILT_TAP0_MINV);
  else
    assert(wiener_info->hfilter[0] == 0 &&
           wiener_info->hfilter[WIENER_WIN - 1] == 0);
  aom_write_primitive_refsubexpfin(
      wb, WIENER_FILT_TAP1_MAXV - WIENER_FILT_TAP1_MINV + 1,
      WIENER_FILT_TAP1_SUBEXP_K,
      ref_wiener_info->hfilter[1] - WIENER_FILT_TAP1_MINV,
      wiener_info->hfilter[1] - WIENER_FILT_TAP1_MINV);
  aom_write_primitive_refsubexpfin(
      wb, WIENER_FILT_TAP2_MAXV - WIENER_FILT_TAP2_MINV + 1,
      WIENER_FILT_TAP2_SUBEXP_K,
      ref_wiener_info->hfilter[2] - WIENER_FILT_TAP2_MINV,
      wiener_info->hfilter[2] - WIENER_FILT_TAP2_MINV);
  memcpy(ref_wiener_info, wiener_info, sizeof(*wiener_info));
}